

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uparse.cpp
# Opt level: O0

int32_t u_parseCodePointRangeAnyTerminator
                  (char *s,uint32_t *pStart,uint32_t *pEnd,char **terminator,UErrorCode *pErrorCode)

{
  UBool UVar1;
  uint uVar2;
  ulong uVar3;
  uint32_t *puStack_40;
  uint32_t value;
  char *end;
  UErrorCode *pErrorCode_local;
  char **terminator_local;
  uint32_t *pEnd_local;
  uint32_t *pStart_local;
  char *s_local;
  
  end = (char *)pErrorCode;
  pErrorCode_local = (UErrorCode *)terminator;
  terminator_local = (char **)pEnd;
  pEnd_local = pStart;
  pStart_local = (uint32_t *)s;
  UVar1 = U_FAILURE(*pErrorCode);
  if (UVar1 == '\0') {
    if (((pStart_local == (uint32_t *)0x0) || (pEnd_local == (uint32_t *)0x0)) ||
       (terminator_local == (char **)0x0)) {
      end[0] = '\x01';
      end[1] = '\0';
      end[2] = '\0';
      end[3] = '\0';
      s_local._4_4_ = 0;
    }
    else {
      pStart_local = (uint32_t *)u_skipWhitespace((char *)pStart_local);
      uVar3 = strtoul((char *)pStart_local,(char **)&stack0xffffffffffffffc0,0x10);
      uVar2 = (uint)uVar3;
      if ((pStart_local < puStack_40) && (uVar2 < 0x110000)) {
        *(uint *)terminator_local = uVar2;
        *pEnd_local = uVar2;
        pStart_local = (uint32_t *)u_skipWhitespace((char *)puStack_40);
        if (((char)*pStart_local == '.') && (*(char *)((long)pStart_local + 1) == '.')) {
          pStart_local = (uint32_t *)u_skipWhitespace((char *)((long)pStart_local + 2));
          uVar3 = strtoul((char *)pStart_local,(char **)&stack0xffffffffffffffc0,0x10);
          uVar2 = (uint)uVar3;
          if ((pStart_local < puStack_40) && (uVar2 < 0x110000)) {
            *(uint *)terminator_local = uVar2;
            if (uVar2 < *pEnd_local) {
              end[0] = '\t';
              end[1] = '\0';
              end[2] = '\0';
              end[3] = '\0';
              s_local._4_4_ = 0;
            }
            else {
              *(uint32_t **)pErrorCode_local = puStack_40;
              s_local._4_4_ = (uVar2 - *pEnd_local) + 1;
            }
          }
          else {
            end[0] = '\t';
            end[1] = '\0';
            end[2] = '\0';
            end[3] = '\0';
            s_local._4_4_ = 0;
          }
        }
        else {
          *(uint32_t **)pErrorCode_local = puStack_40;
          s_local._4_4_ = 1;
        }
      }
      else {
        end[0] = '\t';
        end[1] = '\0';
        end[2] = '\0';
        end[3] = '\0';
        s_local._4_4_ = 0;
      }
    }
  }
  else {
    s_local._4_4_ = 0;
  }
  return s_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
u_parseCodePointRangeAnyTerminator(const char *s,
                                   uint32_t *pStart, uint32_t *pEnd,
                                   const char **terminator,
                                   UErrorCode *pErrorCode) {
    char *end;
    uint32_t value;

    if(U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(s==NULL || pStart==NULL || pEnd==NULL) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    /* read the start code point */
    s=u_skipWhitespace(s);
    value=(uint32_t)uprv_strtoul(s, &end, 16);
    if(end<=s || value>=0x110000) {
        *pErrorCode=U_PARSE_ERROR;
        return 0;
    }
    *pStart=*pEnd=value;

    /* is there a "..end"? */
    s=u_skipWhitespace(end);
    if(*s!='.' || s[1]!='.') {
        *terminator=end;
        return 1;
    }
    s=u_skipWhitespace(s+2);

    /* read the end code point */
    value=(uint32_t)uprv_strtoul(s, &end, 16);
    if(end<=s || value>=0x110000) {
        *pErrorCode=U_PARSE_ERROR;
        return 0;
    }
    *pEnd=value;

    /* is this a valid range? */
    if(value<*pStart) {
        *pErrorCode=U_PARSE_ERROR;
        return 0;
    }

    *terminator=end;
    return value-*pStart+1;
}